

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O0

void printMemOperand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint RegNo;
  uint RegNo_00;
  uint uVar3;
  MCOperand *op;
  int64_t iVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar7;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  char nd;
  char st;
  cs_tms320c64x *tms320c64x;
  uint unit;
  uint mode;
  uint offset;
  uint base;
  uint scaled;
  int64_t Val;
  MCOperand *Op;
  char cVar8;
  char cVar9;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar4 = MCOperand_getImm(op);
  RegNo = (uint)(iVar4 >> 0xc) & 0x7f;
  RegNo_00 = (uint)(iVar4 >> 5) & 0x7f;
  uVar3 = (uint)(iVar4 >> 1) & 0xf;
  if ((iVar4 >> 0x13 & 1U) == 0) {
    cVar9 = '(';
    cVar8 = ')';
  }
  else {
    cVar9 = '[';
    cVar8 = ']';
  }
  switch(uVar3) {
  case 0:
    pcVar5 = getRegisterName(RegNo);
    SStream_concat(in_RDX,"*-%s%c%u%c",pcVar5,(ulong)(uint)(int)cVar9,(ulong)RegNo_00,
                   (ulong)(uint)(int)cVar8);
    break;
  case 1:
    pcVar5 = getRegisterName(RegNo);
    SStream_concat(in_RDX,"*+%s%c%u%c",pcVar5,(ulong)(uint)(int)cVar9,(ulong)RegNo_00,
                   (ulong)(uint)(int)cVar8);
    break;
  case 4:
    pcVar5 = getRegisterName(RegNo);
    pcVar6 = getRegisterName(RegNo_00);
    SStream_concat(in_RDX,"*-%s%c%s%c",pcVar5,(ulong)(uint)(int)cVar9,pcVar6,(ulong)(uint)(int)cVar8
                  );
    break;
  case 5:
    pcVar5 = getRegisterName(RegNo);
    pcVar6 = getRegisterName(RegNo_00);
    SStream_concat(in_RDX,"*+%s%c%s%c",pcVar5,(ulong)(uint)(int)cVar9,pcVar6,(ulong)(uint)(int)cVar8
                  );
    break;
  case 8:
    pcVar5 = getRegisterName(RegNo);
    SStream_concat(in_RDX,"*--%s%c%u%c",pcVar5,(ulong)(uint)(int)cVar9,(ulong)RegNo_00,
                   (ulong)(uint)(int)cVar8);
    break;
  case 9:
    pcVar5 = getRegisterName(RegNo);
    SStream_concat(in_RDX,"*++%s%c%u%c",pcVar5,(ulong)(uint)(int)cVar9,(ulong)RegNo_00,
                   (ulong)(uint)(int)cVar8);
    break;
  case 10:
    pcVar5 = getRegisterName(RegNo);
    SStream_concat(in_RDX,"*%s--%c%u%c",pcVar5,(ulong)(uint)(int)cVar9,(ulong)RegNo_00,
                   (ulong)(uint)(int)cVar8);
    break;
  case 0xb:
    pcVar5 = getRegisterName(RegNo);
    SStream_concat(in_RDX,"*%s++%c%u%c",pcVar5,(ulong)(uint)(int)cVar9,(ulong)RegNo_00,
                   (ulong)(uint)(int)cVar8);
    break;
  case 0xc:
    pcVar5 = getRegisterName(RegNo);
    pcVar6 = getRegisterName(RegNo_00);
    SStream_concat(in_RDX,"*--%s%c%s%c",pcVar5,(ulong)(uint)(int)cVar9,pcVar6,
                   (ulong)(uint)(int)cVar8);
    break;
  case 0xd:
    pcVar5 = getRegisterName(RegNo);
    pcVar6 = getRegisterName(RegNo_00);
    SStream_concat(in_RDX,"*++%s%c%s%c",pcVar5,(ulong)(uint)(int)cVar9,pcVar6,
                   (ulong)(uint)(int)cVar8);
    break;
  case 0xe:
    pcVar5 = getRegisterName(RegNo);
    pcVar6 = getRegisterName(RegNo_00);
    SStream_concat(in_RDX,"*%s--%c%s%c",pcVar5,(ulong)(uint)(int)cVar9,pcVar6,
                   (ulong)(uint)(int)cVar8);
    break;
  case 0xf:
    pcVar5 = getRegisterName(RegNo);
    pcVar6 = getRegisterName(RegNo_00);
    SStream_concat(in_RDX,"*%s++%c%s%c",pcVar5,(ulong)(uint)(int)cVar9,pcVar6,
                   (ulong)(uint)(int)cVar8);
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    pcVar2 = in_RDI->flat_insn->detail;
    paVar7 = &pcVar2->field_6;
    puVar1 = pcVar2->groups + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x11;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(pcVar2->groups + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x15) = RegNo;
    *(uint *)(pcVar2->groups + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x19) = RegNo_00;
    *(uint *)(pcVar2->groups + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1d) = ((uint)iVar4 & 1) + 1
    ;
    *(uint *)(pcVar2->groups + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x21) =
         (uint)(iVar4 >> 0x13) & 1;
    switch(uVar3) {
    case 0:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 1;
      break;
    case 1:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 1;
      break;
    case 4:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 1;
      break;
    case 5:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 1;
      break;
    case 8:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 2;
      break;
    case 9:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 2;
      break;
    case 10:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 3;
      break;
    case 0xb:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 3;
      break;
    case 0xc:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 2;
      break;
    case 0xd:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 2;
      break;
    case 0xe:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 3;
      break;
    case 0xf:
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x18) = 2;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x1c) = 1;
      *(undefined4 *)((long)paVar7 + (ulong)(paVar7->x86).prefix[0] * 0x20 + 0x20) = 3;
    }
    (paVar7->x86).prefix[0] = (paVar7->x86).prefix[0] + '\x01';
  }
  return;
}

Assistant:

static void printMemOperand(MCInst *MI, int opNum, SStream *O, const char *Modifier)
{
	MCOperand *MO;

	set_mem_access(MI, true);
	printOperand(MI, opNum, O);

	// If this is an ADD operand, emit it like normal operands.
	if (Modifier && !strcmp(Modifier, "arith")) {
		SStream_concat0(O, ", ");
		printOperand(MI, opNum + 1, O);
		set_mem_access(MI, false);
		return;
	}

	MO = MCInst_getOperand(MI, opNum + 1);

	if (MCOperand_isReg(MO) && (MCOperand_getReg(MO) == SP_G0)) {
		set_mem_access(MI, false);
		return;   // don't print "+%g0"
	}

	if (MCOperand_isImm(MO) && (MCOperand_getImm(MO) == 0)) {
		set_mem_access(MI, false);
		return;   // don't print "+0"
	}

	SStream_concat0(O, "+");	// qq

	printOperand(MI, opNum + 1, O);
	set_mem_access(MI, false);
}